

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O1

void html_screenshot(char *path,wchar_t mode,term_conflict *other_term)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  wchar_t wVar11;
  char *s;
  ang_file *f;
  wchar_t y;
  char *pcVar12;
  wchar_t x;
  wchar_t wVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  wchar_t c;
  wchar_t a;
  wchar_t local_7c;
  wchar_t other_wid;
  wchar_t local_74;
  wchar_t local_70;
  wchar_t other_hgt;
  wchar_t main_hgt;
  wchar_t main_wid;
  ulong local_60;
  uint local_58;
  int local_54;
  term *local_50;
  char *local_48;
  term_conflict *local_40;
  char *local_38;
  
  a = L'\x01';
  c = L' ';
  local_50 = Term;
  local_38 = "[/COLOR][COLOR=\"#%02X%02X%02X\"]";
  if (mode == L'\0') {
    local_38 = "</font><font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">";
  }
  wVar9 = text_wcsz();
  s = (char *)mem_alloc((long)(wVar9 + L'\x01'));
  f = file_open(path,MODE_WRITE,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    mem_free(s);
    plog_fmt("Cannot write the \'%s\' file!",path);
    return;
  }
  Term_get_size(&main_wid,&main_hgt);
  if (other_term == (term_conflict *)0x0) {
    other_wid = L'\0';
    other_hgt = L'\0';
  }
  else {
    Term_activate((term *)other_term);
    Term_get_size(&other_wid,&other_hgt);
    Term_activate(local_50);
  }
  local_60 = (ulong)(uint)main_wid;
  local_74 = other_hgt;
  if (other_hgt < main_hgt) {
    local_74 = main_hgt;
  }
  local_70 = main_wid + L'\x01' + other_wid;
  if (other_wid < L'\x01') {
    local_70 = main_wid;
  }
  if (mode == L'\0') {
    file_putf(f,"<!DOCTYPE html><html><head>\n");
    file_putf(f,"  <meta http-equiv=\'Content-Type\' content=\'text/html; charset=utf-8\'>\n");
    file_putf(f,"  <meta name=\'generator\' content=\'%s\'>\n",buildid);
    file_putf(f,"  <title>%s</title>\n",path);
    file_putf(f,"</head>\n\n");
    file_putf(f,"<body style=\'color: #%02X%02X%02X; background: #%02X%02X%02X;\'>\n",
              (ulong)angband_color_table[1][1],(ulong)angband_color_table[1][2],
              (ulong)angband_color_table[1][3],(ulong)angband_color_table[0][1],
              (ulong)angband_color_table[0][2],(ulong)angband_color_table[0][3]);
    file_putf(f,"<pre>\n");
  }
  else {
    file_putf(f,"[CODE][TT][BC=\"#%02X%02X%02X\"][COLOR=\"#%02X%02X%02X\"]\n",
              (ulong)angband_color_table[0][1],(ulong)angband_color_table[0][2],
              (ulong)angband_color_table[0][3],(ulong)angband_color_table[1][1],
              (ulong)angband_color_table[1][2],(ulong)angband_color_table[1][3]);
  }
  bVar16 = false;
  if (L'\0' < local_74) {
    local_54 = (uint)local_60 + 1;
    local_48 = s + 1;
    local_58 = ~(uint)local_60;
    local_7c = L'\x01';
    wVar9 = L'\0';
    iVar14 = 0;
    local_40 = other_term;
    do {
      if (L'\0' < local_70) {
        wVar13 = L'\0';
        do {
          if ((wVar13 < main_wid) && (wVar9 < main_hgt)) {
            iVar7 = Term->sidebar_mode;
            wVar11 = row_top_map[iVar7];
            y = wVar9;
            x = wVar13;
            if ((((wVar9 < wVar11) || (local_74 - row_bottom_map[iVar7] <= wVar9)) ||
                (wVar8 = col_map[iVar7], wVar13 < wVar8)) ||
               ((x = (uint)tile_width * (wVar13 - wVar8) + wVar8, x < local_70 &&
                (y = (wVar9 - wVar11) * (uint)tile_height + wVar11,
                y < local_74 - row_bottom_map[iVar7])))) {
              Term_what(x,y,&a,&c);
            }
            else {
LAB_001d712f:
              a = L'\x01';
              c = L' ';
            }
          }
          else {
            if ((wVar13 <= (wchar_t)local_60) ||
               ((other_wid + local_54 <= wVar13 || (other_hgt <= wVar9)))) goto LAB_001d712f;
            wVar11 = local_58 + wVar13;
            if (wVar11 == L'\0') {
              Term_activate((term *)local_40);
            }
            Term_what(wVar11,wVar9,&a,&c);
            if (wVar13 == other_wid + (wchar_t)local_60) {
              Term_activate(local_50);
            }
          }
          wVar11 = a + L'ÿ';
          if (L'\xffffffff' < a) {
            wVar11 = a;
          }
          iVar10 = a % 0x20;
          iVar15 = wVar11 >> 8;
          iVar7 = iVar15;
          if (iVar15 != 0) {
            if (iVar15 == 2) {
              iVar7 = 0x1c;
            }
            else {
              iVar7 = iVar10;
              if ((iVar15 != 1) && (iVar7 = iVar14, 0x2ff < (uint)a)) {
                __assert_fail("(a >= 0) && (a < BG_MAX * MULT_BG)",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-command.c"
                              ,0x19d,"void html_screenshot(const char *, int, term *)");
              }
            }
          }
          iVar14 = iVar7;
          if ((local_7c != a) && ((mode == L'\0' || (c != L' ')))) {
            if (local_7c == L'\x01' && mode == L'\0') {
              bVar1 = angband_color_table[iVar10][1];
              bVar2 = angband_color_table[iVar10][2];
              bVar3 = angband_color_table[iVar10][3];
              bVar4 = angband_color_table[iVar14][1];
              bVar5 = angband_color_table[iVar14][2];
              bVar6 = angband_color_table[iVar14][3];
              pcVar12 = "<font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">";
LAB_001d7246:
              file_putf(f,pcVar12,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,(ulong)bVar5,
                        (ulong)bVar6);
            }
            else {
              if ((iVar10 != 1) || (iVar14 != 0 || mode != L'\0')) {
                bVar1 = angband_color_table[iVar10][1];
                bVar2 = angband_color_table[iVar10][2];
                bVar3 = angband_color_table[iVar10][3];
                bVar4 = angband_color_table[iVar14][1];
                bVar5 = angband_color_table[iVar14][2];
                bVar6 = angband_color_table[iVar14][3];
                pcVar12 = local_38;
                goto LAB_001d7246;
              }
              file_putf(f,"%s","</font>");
            }
            local_7c = a;
          }
          if (mode == L'\0') {
            if (c == L'&') {
              pcVar12 = "&amp;";
            }
            else if (c == L'>') {
              pcVar12 = "&gt;";
            }
            else {
              if (c != L'<') goto LAB_001d7267;
              pcVar12 = "&lt;";
            }
            file_putf(f,pcVar12);
          }
          else {
LAB_001d7267:
            wVar11 = text_wctomb(s,c);
            if (wVar11 < L'\x01') {
              *s = ' ';
              pcVar12 = local_48;
            }
            else {
              pcVar12 = s + (uint)wVar11;
            }
            *pcVar12 = '\0';
            file_putf(f,"%s",s);
          }
          wVar13 = wVar13 + L'\x01';
        } while (local_70 != wVar13);
      }
      file_putf(f,"\n");
      wVar9 = wVar9 + L'\x01';
    } while (wVar9 != local_74);
    bVar16 = local_7c != L'\x01';
  }
  if ((mode == L'\0') && (bVar16)) {
    file_putf(f,"%s","</font>");
  }
  if (mode == L'\0') {
    file_putf(f,"</pre>\n");
    file_putf(f,"</body>\n");
    pcVar12 = "</html>\n";
  }
  else {
    pcVar12 = "[/COLOR][/BC][/TT][/CODE]\n";
  }
  file_putf(f,pcVar12);
  file_close(f);
  mem_free(s);
  return;
}

Assistant:

void html_screenshot(const char *path, int mode, term *other_term)
{
	/* Put the contents of the other terminal on the right by default. */
	bool other_left = false;
	int y, x;
	int main_wid, main_hgt, other_wid, other_hgt, wid, hgt;
	int main_xst, other_xst;
	int a = COLOUR_WHITE;
	int oa = COLOUR_WHITE;
	int fg_colour = COLOUR_WHITE;
	int bg_colour = COLOUR_DARK;
	wchar_t c = L' ';
	term *main_term = Term;

	const char *new_color_fmt = "<font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">";
	const char *change_color_fmt = (mode == 0) ?
					"</font><font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">"
					: "[/COLOR][COLOR=\"#%02X%02X%02X\"]";
	const char *close_color_str = "</font>";

	char *mbbuf;
	ang_file *fp;

	mbbuf = mem_alloc(text_wcsz() + 1);
	fp = file_open(path, MODE_WRITE, FTYPE_TEXT);

	/* Oops */
	if (!fp) {
		mem_free(mbbuf);
		plog_fmt("Cannot write the '%s' file!", path);
		return;
	}

	/* Retrieve current screen size */
	Term_get_size(&main_wid, &main_hgt);
	if (other_term) {
		Term_activate(other_term);
		Term_get_size(&other_wid, &other_hgt);
		Term_activate(main_term);
	} else {
		other_wid = 0;
		other_hgt = 0;
	}
	if (other_left) {
		other_xst = 0;
		main_xst = (other_wid > 0) ? other_wid + 1 : 0;
	} else {
		other_xst = main_wid + 1;
		main_xst = 0;
	}
	hgt = MAX(main_hgt, other_hgt);
	wid = (other_wid > 0) ? main_wid + other_wid + 1 : main_wid;

	if (mode == 0) {
		file_putf(fp, "<!DOCTYPE html><html><head>\n");
		file_putf(fp, "  <meta http-equiv='Content-Type' content='text/html; charset=utf-8'>\n");
		file_putf(fp, "  <meta name='generator' content='%s'>\n", buildid);
		file_putf(fp, "  <title>%s</title>\n", path);
		file_putf(fp, "</head>\n\n");
		file_putf(fp, "<body style='color: #%02X%02X%02X; background: #%02X%02X%02X;'>\n",
			angband_color_table[COLOUR_WHITE][1],
			angband_color_table[COLOUR_WHITE][2],
			angband_color_table[COLOUR_WHITE][3],
			angband_color_table[COLOUR_DARK][1],
			angband_color_table[COLOUR_DARK][2],
			angband_color_table[COLOUR_DARK][3]);
		file_putf(fp, "<pre>\n");
	} else {
		file_putf(fp, "[CODE][TT][BC=\"#%02X%02X%02X\"][COLOR=\"#%02X%02X%02X\"]\n",
			angband_color_table[COLOUR_DARK][1],
			angband_color_table[COLOUR_DARK][2],
			angband_color_table[COLOUR_DARK][3],
			angband_color_table[COLOUR_WHITE][1],
			angband_color_table[COLOUR_WHITE][2],
			angband_color_table[COLOUR_WHITE][3]);
	}

	/* Dump the screen */
	for (y = 0; y < hgt; y++) {
		for (x = 0; x < wid; x++) {
			/* Get the attr/char */
			if (x >= main_xst && x < main_xst + main_wid
					&& y < main_hgt) {
				screenshot_term_query(wid, hgt, x - main_xst, y,
					&a, &c);
			} else if (x >= other_xst && x < other_xst + other_wid
					&& y < other_hgt) {
				if (x == other_xst) {
					Term_activate(other_term);
				}
				Term_what(x - other_xst, y, &a, &c);
				if (x == other_xst + other_wid - 1) {
					Term_activate(main_term);
				}
			} else {
				a = COLOUR_WHITE;
				c = ' ';
			}

			/* Set the foreground and background */
			fg_colour = a % MAX_COLORS;
			switch (a / MULT_BG)
			{
				case BG_BLACK:
					bg_colour = COLOUR_DARK;
					break;
				case BG_SAME:
					bg_colour = fg_colour;
					break;
				case BG_DARK:
					bg_colour = COLOUR_SHADE;
					break;
				default:
					assert((a >= 0)
						&& (a < BG_MAX * MULT_BG));
			}

			/*
			 * Color change (for forum text, ignore changes if the character is
			 * a space since the forum software strips [COLOR][/COLOR] elements that
			 * only contain whitespace)
			 */
			if (oa != a && (mode == 0 || c != L' ')) {
				if (oa == COLOUR_WHITE && mode == 0) {
					/* From the default white to another color */
					file_putf(fp, new_color_fmt,
							  angband_color_table[fg_colour][1],
							  angband_color_table[fg_colour][2],
							  angband_color_table[fg_colour][3],
							  angband_color_table[bg_colour][1],
							  angband_color_table[bg_colour][2],
							  angband_color_table[bg_colour][3]);
				} else if (fg_colour == COLOUR_WHITE
						&& bg_colour == COLOUR_DARK
						&& mode == 0) {
					/* From another color to the default white */
					file_putf(fp, "%s", close_color_str);
				} else {
					/* Change colors */
					file_putf(fp, change_color_fmt,
							  angband_color_table[fg_colour][1],
							  angband_color_table[fg_colour][2],
							  angband_color_table[fg_colour][3],
							  angband_color_table[bg_colour][1],
							  angband_color_table[bg_colour][2],
							  angband_color_table[bg_colour][3]);
				}

				/* Remember the last color */
				oa = a;
			}

			/* Write the character and escape special HTML characters */
			if (mode == 0) write_html_escape_char(fp, mbbuf, c);
			else {
				int nc = text_wctomb(mbbuf, c);

				if (nc > 0) {
					mbbuf[nc] = 0;
				} else {
					mbbuf[0] = ' ';
					mbbuf[1] = 0;
				}
				file_putf(fp, "%s", mbbuf);
			}
		}

		/* End the row */
		file_putf(fp, "\n");
	}

	/* Close the last font-color tag if necessary */
	if (oa != COLOUR_WHITE && mode == 0) file_putf(fp, "%s", close_color_str);

	if (mode == 0) {
		file_putf(fp, "</pre>\n");
		file_putf(fp, "</body>\n");
		file_putf(fp, "</html>\n");
	} else {
		file_putf(fp, "[/COLOR][/BC][/TT][/CODE]\n");
	}

	/* Close it */
	file_close(fp);

	mem_free(mbbuf);
}